

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::strengthenInequalities
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt *num_strengthened)

{
  anon_class_16_2_ce47daea_for__M_pred __pred;
  anon_class_24_3_1089ec81_for__M_pred __pred_00;
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  int *piVar4;
  reference pvVar5;
  double *pdVar6;
  reference piVar7;
  size_type sVar8;
  size_type sVar9;
  int *in_RDX;
  long *in_RDI;
  double dVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  HighsCDouble HVar11;
  HighsCDouble rhs;
  HighsCDouble lhs;
  anon_class_48_6_c3dafeef updateNonZeros;
  double threshold;
  HighsInt in_stack_000002ec;
  HighsPostsolveStack *in_stack_000002f0;
  HPresolve *in_stack_000002f8;
  size_t i_2;
  HighsInt slackind;
  size_t i_1;
  double step;
  HighsCDouble slackupper;
  double coverrhs;
  double al;
  HighsInt alpos;
  double delta;
  HighsInt index;
  size_t i;
  HighsCDouble lambda;
  double smallVal;
  Result __result_1;
  Result __result;
  double ub;
  double weight;
  int8_t comp;
  HighsInt col;
  HighsInt pos;
  bool skiprow;
  double scale;
  HighsCDouble continuouscontribution;
  HighsCDouble maxviolation;
  HighsInt rowsize_limit;
  HighsInt row;
  HighsInt check_time_frequency;
  vector<int,_std::allocator<int>_> cover;
  vector<double,_std::allocator<double>_> coefs;
  vector<int,_std::allocator<int>_> stack;
  vector<int,_std::allocator<int>_> positions;
  vector<int,_std::allocator<int>_> indices;
  vector<double,_std::allocator<double>_> upper;
  vector<double,_std::allocator<double>_> reducedcost;
  vector<signed_char,_std::allocator<signed_char>_> complementation;
  HPresolve *in_stack_fffffffffffffa38;
  HighsCDouble *in_stack_fffffffffffffa40;
  double *in_stack_fffffffffffffa48;
  anon_class_8_1_4c1942eb in_stack_fffffffffffffa50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffa58;
  const_iterator in_stack_fffffffffffffa60;
  const_iterator in_stack_fffffffffffffa68;
  iterator in_stack_fffffffffffffa70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffa78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  iterator in_stack_fffffffffffffaa8;
  HighsCDouble *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  HighsInt in_stack_fffffffffffffabc;
  anon_class_48_6_c3dafeef *in_stack_fffffffffffffac0;
  bool local_449;
  bool local_422;
  bool local_3d9;
  HighsCDouble local_3c0;
  HighsCDouble local_3b0;
  vector<int,_std::allocator<int>_> *local_3a0;
  vector<double,_std::allocator<double>_> *local_398;
  HighsCDouble *local_390;
  undefined1 *local_380;
  undefined1 *local_378;
  int *local_370;
  int *local_368;
  HPresolve *local_358;
  HighsCDouble *pHStack_350;
  double *local_348;
  int *local_340;
  int *local_338;
  int *local_330;
  HighsCDouble local_320;
  double local_310;
  int *local_308;
  int *local_300;
  vector<double,_std::allocator<double>_> *local_2f0;
  int *local_2e0;
  int *local_2d8;
  int *local_2d0;
  size_type local_2c0;
  double local_2b8;
  undefined4 local_2ac;
  HighsCDouble local_2a8;
  double local_298;
  double local_290;
  double local_288;
  size_type local_280;
  anon_class_48_6_c3dafeef *local_278;
  HighsCDouble local_270;
  double local_260;
  double local_258;
  double local_250;
  HighsCDouble local_248;
  double local_238;
  double local_230;
  value_type local_228;
  vector<double,_std::allocator<double>_> *local_220;
  int *local_218;
  int *local_210;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_208;
  int local_1fc;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  int local_1dc;
  size_type local_1d8;
  HighsCDouble local_1d0;
  vector<double,_std::allocator<double>_> *local_1c0;
  int *local_1b8;
  int *local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  Result local_180;
  undefined4 local_17c;
  Result local_178;
  undefined4 local_174;
  double local_170;
  double local_168;
  undefined1 local_15d;
  int local_15c;
  int local_158;
  bool local_151;
  HighsCDouble local_150;
  HighsCDouble local_140;
  double local_130;
  HighsCDouble local_128;
  HighsCDouble local_118 [2];
  int local_f4 [3];
  uint local_e8;
  undefined4 local_e4;
  vector<int,_std::allocator<int>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8 [2];
  undefined1 local_98 [24];
  vector<int,_std::allocator<int>_> local_80;
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  undefined1 local_38 [24];
  int *local_20;
  Result local_4;
  
  local_20 = in_RDX;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)0x70f89c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x70f8a9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x70f8b6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x70f8c3);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x70f8d0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x70f8dd);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x70f8ea);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x70f8f7);
  *local_20 = 0;
  local_e4 = 100;
  for (local_e8 = 0; local_e8 != *(uint *)(*in_RDI + 4); local_e8 = local_e8 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)(int)local_e8);
    if (1 < *pvVar2) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),
                          (long)(int)local_e8);
      if ((*pvVar3 != -INFINITY) || (NAN(*pvVar3))) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),
                            (long)(int)local_e8);
        if ((*pvVar3 != INFINITY) || (NAN(*pvVar3))) goto LAB_007111d3;
      }
      local_f4[1] = 1000;
      local_f4[0] = (*(int *)*in_RDI - *(int *)((long)in_RDI + 0x624)) / 0x14;
      piVar4 = std::max<int>(local_f4 + 1,local_f4);
      local_f4[2] = *piVar4;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)(int)local_e8);
      if (*pvVar2 <= local_f4[2]) {
        HighsCDouble::HighsCDouble(&local_128,0.0);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),
                            (long)(int)local_e8);
        if ((*pvVar3 != -INFINITY) || (NAN(*pvVar3))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),
                              (long)(int)local_e8);
          HighsCDouble::HighsCDouble(&local_140,*pvVar3);
          local_118[0].hi = local_140.hi;
          local_118[0].lo = local_140.lo;
          local_130 = -1.0;
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),
                              (long)(int)local_e8);
          HighsCDouble::HighsCDouble(&local_150,-*pvVar3);
          local_118[0].hi = local_150.hi;
          local_118[0].lo = local_150.lo;
          local_130 = 1.0;
        }
        std::vector<signed_char,_std::allocator<signed_char>_>::clear
                  ((vector<signed_char,_std::allocator<signed_char>_> *)0x70fc09);
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x70fc16);
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x70fc23);
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x70fc30)
        ;
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x70fc3d)
        ;
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)(int)local_e8);
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  ((vector<signed_char,_std::allocator<signed_char>_> *)
                   in_stack_fffffffffffffa70._M_current,
                   (size_type)in_stack_fffffffffffffa68._M_current);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)(int)local_e8);
        std::vector<double,_std::allocator<double>_>::reserve
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa70._M_current,
                   (size_type)in_stack_fffffffffffffa68._M_current);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)(int)local_e8);
        std::vector<double,_std::allocator<double>_>::reserve
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa70._M_current,
                   (size_type)in_stack_fffffffffffffa68._M_current);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)(int)local_e8);
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa70._M_current,
                   (size_type)in_stack_fffffffffffffa68._M_current);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)(int)local_e8);
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa70._M_current,
                   (size_type)in_stack_fffffffffffffa68._M_current);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)(int)local_e8);
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa70._M_current,
                   (size_type)in_stack_fffffffffffffa68._M_current);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x17),(long)(int)local_e8);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50.reducedcost,
                   (value_type_conflict2 *)in_stack_fffffffffffffa48);
        local_151 = false;
        while (bVar1 = std::vector<int,_std::allocator<int>_>::empty
                                 ((vector<int,_std::allocator<int>_> *)
                                  in_stack_fffffffffffffa50.reducedcost), ((bVar1 ^ 0xffU) & 1) != 0
              ) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::back
                             ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa40);
          local_158 = *pvVar2;
          std::vector<int,_std::allocator<int>_>::pop_back
                    ((vector<int,_std::allocator<int>_> *)0x70fdc2);
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1d),(long)local_158);
          if (*pvVar2 != -1) {
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1d),(long)local_158);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50.reducedcost,
                       (value_type_conflict2 *)in_stack_fffffffffffffa48);
          }
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)local_158);
          if (*pvVar2 != -1) {
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)local_158);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50.reducedcost,
                       (value_type_conflict2 *)in_stack_fffffffffffffa48);
          }
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)local_158);
          local_15c = *pvVar2;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),
                              (long)local_15c);
          local_3d9 = true;
          if ((*pvVar3 != -INFINITY) || (NAN(*pvVar3))) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),
                                (long)local_15c);
            local_3d9 = *pvVar3 == INFINITY;
          }
          local_151 = local_3d9;
          if (local_3d9 != false) break;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),
                              (long)local_158);
          local_168 = *pvVar3 * local_130;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),
                              (long)local_15c);
          dVar10 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),
                              (long)local_15c);
          local_170 = dVar10 - *pvVar3;
          if (local_168 <= 0.0) {
            local_15d = 0xff;
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_15c);
            HighsCDouble::operator+=
                      ((HighsCDouble *)in_stack_fffffffffffffa50.reducedcost,
                       (double)in_stack_fffffffffffffa48);
            local_168 = -local_168;
          }
          else {
            local_15d = 1;
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_15c);
            HighsCDouble::operator+=
                      ((HighsCDouble *)in_stack_fffffffffffffa50.reducedcost,
                       (double)in_stack_fffffffffffffa48);
          }
          if (((double)in_RDI[4] < local_170) && ((double)in_RDI[4] < local_168)) {
            pvVar5 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                               ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                                (*in_RDI + 0x178),(long)local_15c);
            if (*pvVar5 == kContinuous) {
              HighsCDouble::operator+=
                        ((HighsCDouble *)in_stack_fffffffffffffa50.reducedcost,
                         (double)in_stack_fffffffffffffa48);
            }
            else {
              sVar9 = std::vector<double,_std::allocator<double>_>::size(&local_50);
              local_174 = (undefined4)sVar9;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa40,
                         (value_type_conflict2 *)in_stack_fffffffffffffa38);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50.reducedcost,
                         (value_type_conflict2 *)in_stack_fffffffffffffa48);
              std::vector<double,_std::allocator<double>_>::push_back
                        (in_stack_fffffffffffffa50.reducedcost,in_stack_fffffffffffffa48);
              std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                        ((vector<signed_char,_std::allocator<signed_char>_> *)
                         in_stack_fffffffffffffa50.reducedcost,
                         (value_type_conflict *)in_stack_fffffffffffffa48);
              std::vector<double,_std::allocator<double>_>::push_back
                        (in_stack_fffffffffffffa50.reducedcost,in_stack_fffffffffffffa48);
            }
          }
        }
        if ((((local_e8 & 100) == 0) ||
            (pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),
                                 (long)(int)local_e8), local_f4[2] < *pvVar2 * 10)) &&
           (local_178 = checkTimeLimit(in_stack_fffffffffffffa38), local_4 = local_178,
           local_178 != kOk)) goto LAB_007111ff;
        if ((local_151 & 1U) == 0) {
          bVar1 = HighsCDouble::operator<=
                            (in_stack_fffffffffffffa40,(double)in_stack_fffffffffffffa38);
          if (bVar1) {
            local_180 = rowPresolve(in_stack_000002f8,in_stack_000002f0,in_stack_000002ec);
            local_4 = local_180;
            if (local_180 != kOk) goto LAB_007111ff;
          }
          else {
            local_190 = (double)in_RDI[4] * 100.0;
            dVar10 = (double)in_RDI[4];
            local_198 = HighsCDouble::operator_cast_to_double(local_118);
            local_198 = dVar10 * local_198;
            pdVar6 = std::max<double>(&local_190,&local_198);
            local_188 = *pdVar6;
            while( true ) {
              HVar11 = HighsCDouble::operator-
                                 (in_stack_fffffffffffffa40,
                                  (HighsCDouble *)in_stack_fffffffffffffa38);
              local_1a8 = HVar11.hi;
              local_1a0 = HVar11.lo;
              bVar1 = HighsCDouble::operator<=
                                (in_stack_fffffffffffffa40,(double)in_stack_fffffffffffffa38);
              local_422 = true;
              if (!bVar1) {
                local_422 = std::vector<int,_std::allocator<int>_>::empty
                                      ((vector<int,_std::allocator<int>_> *)
                                       in_stack_fffffffffffffa50.reducedcost);
              }
              if (local_422 != false) break;
              local_1b0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                           ((vector<int,_std::allocator<int>_> *)
                                            in_stack_fffffffffffffa38);
              local_1b8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            in_stack_fffffffffffffa38);
              local_1c0 = &local_50;
              pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0>
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         in_stack_fffffffffffffa60._M_current,in_stack_fffffffffffffa58,
                         in_stack_fffffffffffffa50);
              HVar11 = HighsCDouble::operator-
                                 (in_stack_fffffffffffffa40,
                                  (HighsCDouble *)in_stack_fffffffffffffa38);
              local_1d0.hi = HVar11.hi;
              local_1d0.lo = HVar11.lo;
              std::vector<int,_std::allocator<int>_>::clear
                        ((vector<int,_std::allocator<int>_> *)0x7104d0);
              std::vector<int,_std::allocator<int>_>::size(&local_80);
              std::vector<int,_std::allocator<int>_>::reserve
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa70._M_current,
                         (size_type)in_stack_fffffffffffffa68._M_current);
              for (local_1d8 = std::vector<int,_std::allocator<int>_>::size(&local_80);
                  local_1d8 != 0; local_1d8 = local_1d8 - 1) {
                pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,local_1d8 - 1)
                ;
                local_1dc = *pvVar2;
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_68,(long)local_1dc);
                dVar10 = *pvVar3;
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_50,(long)local_1dc);
                local_1e8 = dVar10 * *pvVar3;
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_68,(long)local_1dc);
                local_449 = false;
                if (*pvVar3 <= 1000.0) {
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_50,(long)local_1dc);
                  local_449 = false;
                  if (local_188 < *pvVar3) {
                    HVar11 = HighsCDouble::operator-
                                       (in_stack_fffffffffffffa40,(double)in_stack_fffffffffffffa38)
                    ;
                    local_1f8 = HVar11.hi;
                    local_1f0 = HVar11.lo;
                    local_449 = HighsCDouble::operator<=
                                          (in_stack_fffffffffffffa40,
                                           (double)in_stack_fffffffffffffa38);
                  }
                }
                if (local_449 == false) {
                  HighsCDouble::operator-=
                            (in_stack_fffffffffffffa40,(double)in_stack_fffffffffffffa38);
                }
                else {
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)
                             in_stack_fffffffffffffa50.reducedcost,
                             (value_type_conflict2 *)in_stack_fffffffffffffa48);
                }
              }
              bVar1 = std::vector<int,_std::allocator<int>_>::empty
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_fffffffffffffa50.reducedcost);
              if ((bVar1) ||
                 (bVar1 = HighsCDouble::operator<=
                                    (in_stack_fffffffffffffa40,(double)in_stack_fffffffffffffa38),
                 bVar1)) break;
              local_210 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                           ((vector<int,_std::allocator<int>_> *)
                                            in_stack_fffffffffffffa38);
              local_218 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            in_stack_fffffffffffffa38);
              local_220 = &local_50;
              local_208 = std::
                          min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__1>
                                    (in_stack_fffffffffffffa68._M_current,
                                     in_stack_fffffffffffffa60._M_current,
                                     in_stack_fffffffffffffa58._M_current);
              piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_208);
              local_1fc = *piVar7;
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_50,(long)local_1fc);
              local_228 = *pvVar3;
              std::vector<int,_std::allocator<int>_>::size(&local_e0);
              std::vector<double,_std::allocator<double>_>::resize
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffffa60._M_current,
                         (size_type)in_stack_fffffffffffffa58._M_current);
              HVar11 = HighsCDouble::operator/
                                 ((HighsCDouble *)in_stack_fffffffffffffa38,3.65983376121458e-317);
              local_258 = HVar11.hi;
              local_250 = HVar11.lo;
              HVar11 = HighsCDouble::operator-
                                 (in_stack_fffffffffffffa40,(double)in_stack_fffffffffffffa38);
              local_248.hi = HVar11.hi;
              local_248.lo = HVar11.lo;
              dVar10 = HighsCDouble::operator_cast_to_double(&local_248);
              local_238 = ceil(dVar10);
              local_260 = 1.0;
              pdVar6 = std::max<double>(&local_238,&local_260);
              local_230 = *pdVar6;
              HighsCDouble::HighsCDouble(&local_270,-local_230);
              local_278 = (anon_class_48_6_c3dafeef *)0x7ff0000000000000;
              for (local_280 = 0; sVar9 = local_280,
                  sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_e0), sVar9 != sVar8;
                  local_280 = local_280 + 1) {
                pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_e0,local_280);
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_50,(long)*pvVar2);
                local_288 = HighsCDouble::operator_cast_to_double(&local_1d0);
                pdVar6 = std::min<double>(pvVar3,&local_288);
                dVar10 = ceil(*pdVar6 / local_228 - *(double *)(in_RDI[1] + 0x108));
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (local_c8,local_280);
                *pvVar3 = dVar10;
                pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_e0,local_280);
                std::vector<double,_std::allocator<double>_>::operator[](&local_68,(long)*pvVar2);
                std::vector<double,_std::allocator<double>_>::operator[](local_c8,local_280);
                HighsCDouble::operator+=
                          ((HighsCDouble *)in_stack_fffffffffffffa50.reducedcost,
                           (double)in_stack_fffffffffffffa48);
                pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_e0,local_280);
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_50,(long)*pvVar2);
                dVar10 = *pvVar3;
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (local_c8,local_280);
                local_290 = dVar10 / *pvVar3;
                pdVar6 = std::min<double>((double *)&local_278,&local_290);
                local_278 = (anon_class_48_6_c3dafeef *)*pdVar6;
              }
              HVar11 = HighsCDouble::operator/
                                 ((HighsCDouble *)in_stack_fffffffffffffa38,3.66027347963937e-317);
              local_2a8.hi = HVar11.hi;
              local_2a8.lo = HVar11.lo;
              local_298 = HighsCDouble::operator_cast_to_double(&local_2a8);
              pdVar6 = std::min<double>((double *)&local_278,&local_298);
              local_278 = (anon_class_48_6_c3dafeef *)*pdVar6;
              HighsCDouble::operator-=(in_stack_fffffffffffffa40,(double)in_stack_fffffffffffffa38);
              sVar9 = std::vector<double,_std::allocator<double>_>::size(&local_50);
              local_2ac = (undefined4)sVar9;
              std::vector<double,_std::allocator<double>_>::push_back
                        (in_stack_fffffffffffffa50.reducedcost,in_stack_fffffffffffffa48);
              local_2b8 = HighsCDouble::operator_cast_to_double(&local_270);
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa40,
                         (value_type_conflict1 *)in_stack_fffffffffffffa38);
              for (local_2c0 = 0; sVar9 = local_2c0,
                  sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_e0), sVar9 != sVar8;
                  local_2c0 = local_2c0 + 1) {
                in_stack_fffffffffffffac0 = local_278;
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (local_c8,local_2c0);
                dVar10 = *pvVar3;
                pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_e0,local_2c0);
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_50,(long)*pvVar2);
                *pvVar3 = -(double)in_stack_fffffffffffffac0 * dVar10 + *pvVar3;
              }
              in_stack_fffffffffffffab0 = (HighsCDouble *)&local_80;
              local_2d8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                           ((vector<int,_std::allocator<int>_> *)
                                            in_stack_fffffffffffffa38);
              local_2e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            in_stack_fffffffffffffa38);
              local_2f0 = &local_50;
              __pred.this = (HPresolve *)in_stack_fffffffffffffa68._M_current;
              __pred.reducedcost =
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa60._M_current;
              local_2d0 = (int *)std::
                                 remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__2>
                                           (in_stack_fffffffffffffa78,
                                            in_stack_fffffffffffffa70._M_current,__pred);
              in_stack_fffffffffffffab8 = SUB84(local_2d0,0);
              in_stack_fffffffffffffabc = (HighsInt)((ulong)local_2d0 >> 0x20);
              __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
              __normal_iterator<int*>
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffa40,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffa38);
              local_300 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            in_stack_fffffffffffffa38);
              __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
              __normal_iterator<int*>
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffa40,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffa38);
              in_stack_fffffffffffffaa8 =
                   std::vector<int,_std::allocator<int>_>::erase
                             (in_stack_fffffffffffffa58._M_current,in_stack_fffffffffffffa68,
                              in_stack_fffffffffffffa60);
              local_308 = in_stack_fffffffffffffaa8._M_current;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50.reducedcost,
                         (value_type_conflict2 *)in_stack_fffffffffffffa48);
            }
            HVar11 = HighsCDouble::operator+
                               (in_stack_fffffffffffffa40,(double)in_stack_fffffffffffffa38);
            __first._M_current = (int *)HVar11.hi;
            __last._M_current = (int *)HVar11.lo;
            local_320.hi = (double)__first._M_current;
            local_320.lo = (double)__last._M_current;
            local_310 = HighsCDouble::operator_cast_to_double(&local_320);
            in_stack_fffffffffffffa78._M_current = (int *)&local_80;
            local_338 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                         ((vector<int,_std::allocator<int>_> *)
                                          in_stack_fffffffffffffa38);
            local_340 = (int *)std::vector<int,_std::allocator<int>_>::end
                                         ((vector<int,_std::allocator<int>_> *)
                                          in_stack_fffffffffffffa38);
            in_stack_fffffffffffffa38 = (HPresolve *)local_98;
            in_stack_fffffffffffffa40 = (HighsCDouble *)&local_50;
            in_stack_fffffffffffffa48 = &local_310;
            __pred_00.reducedcost._0_4_ = in_stack_fffffffffffffab8;
            __pred_00.positions = (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0;
            __pred_00.reducedcost._4_4_ = in_stack_fffffffffffffabc;
            __pred_00.threshold = (double *)in_stack_fffffffffffffac0;
            local_358 = in_stack_fffffffffffffa38;
            pHStack_350 = in_stack_fffffffffffffa40;
            local_348 = in_stack_fffffffffffffa48;
            local_330 = (int *)std::
                               remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__3>
                                         (__first,__last,__pred_00);
            __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
            __normal_iterator<int*>
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffa40,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffa38);
            in_stack_fffffffffffffa68._M_current = (int *)&local_80;
            local_368 = (int *)std::vector<int,_std::allocator<int>_>::end
                                         ((vector<int,_std::allocator<int>_> *)
                                          in_stack_fffffffffffffa38);
            __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
            __normal_iterator<int*>
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffa40,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffa38);
            in_stack_fffffffffffffa70 =
                 std::vector<int,_std::allocator<int>_>::erase
                           (in_stack_fffffffffffffa58._M_current,in_stack_fffffffffffffa68,
                            in_stack_fffffffffffffa60);
            local_370 = in_stack_fffffffffffffa70._M_current;
            bVar1 = std::vector<int,_std::allocator<int>_>::empty
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_fffffffffffffa50.reducedcost);
            if (!bVar1) {
              local_3a0 = &local_80;
              local_398 = &local_50;
              local_390 = local_118;
              local_380 = local_98;
              local_378 = local_38;
              if (0.0 <= local_130) {
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),
                                    (long)(int)local_e8);
                HighsCDouble::HighsCDouble(&local_3c0,*pvVar3);
                strengthenInequalities::anon_class_48_6_c3dafeef::operator()
                          (in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,
                           in_stack_fffffffffffffab0,
                           (HighsInt)((ulong)in_stack_fffffffffffffaa8._M_current >> 0x20));
                in_stack_fffffffffffffa58._M_current =
                     (int *)HighsCDouble::operator_cast_to_double(&local_3c0);
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),
                                    (long)(int)local_e8);
                *pvVar3 = (value_type)in_stack_fffffffffffffa58._M_current;
              }
              else {
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),
                                    (long)(int)local_e8);
                HighsCDouble::HighsCDouble(&local_3b0,*pvVar3);
                strengthenInequalities::anon_class_48_6_c3dafeef::operator()
                          (in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,
                           in_stack_fffffffffffffab0,
                           (HighsInt)((ulong)in_stack_fffffffffffffaa8._M_current >> 0x20));
                in_stack_fffffffffffffa60._M_current =
                     (int *)HighsCDouble::operator_cast_to_double(&local_3b0);
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),
                                    (long)(int)local_e8);
                *pvVar3 = (value_type)in_stack_fffffffffffffa60._M_current;
              }
              sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_80);
              *local_20 = *local_20 + (int)sVar9;
            }
          }
        }
        else {
          std::vector<int,_std::allocator<int>_>::clear
                    ((vector<int,_std::allocator<int>_> *)0x71022c);
        }
      }
    }
LAB_007111d3:
  }
  local_4 = kOk;
LAB_007111ff:
  local_17c = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50.reducedcost);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa50.reducedcost);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50.reducedcost);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50.reducedcost);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa50.reducedcost);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa50.reducedcost);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa50.reducedcost);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)
             in_stack_fffffffffffffa50.reducedcost);
  return local_4;
}

Assistant:

HPresolve::Result HPresolve::strengthenInequalities(
    HighsPostsolveStack& postsolve_stack, HighsInt& num_strengthened) {
  std::vector<int8_t> complementation;
  std::vector<double> reducedcost;
  std::vector<double> upper;
  std::vector<HighsInt> indices;
  std::vector<HighsInt> positions;
  std::vector<HighsInt> stack;
  std::vector<double> coefs;
  std::vector<HighsInt> cover;

  num_strengthened = 0;
  // Check for timeout according to this frequency
  const HighsInt check_time_frequency = 100;

  for (HighsInt row = 0; row != model->num_row_; ++row) {
    if (rowsize[row] <= 1) continue;
    if (model->row_lower_[row] != -kHighsInf &&
        model->row_upper_[row] != kHighsInf)
      continue;

    // do not run on very dense rows as this could get expensive
    HighsInt rowsize_limit =
        std::max(HighsInt{1000}, (model->num_col_ - numDeletedCols) / 20);
    if (rowsize[row] > rowsize_limit) continue;

    // printf("strengthening knapsack of %" HIGHSINT_FORMAT " vars\n",
    // rowsize[row]);

    HighsCDouble maxviolation;
    HighsCDouble continuouscontribution = 0.0;
    double scale;

    if (model->row_lower_[row] != -kHighsInf) {
      // ax >= lb, treat as -ax <= -lb --> -ax + lb <= 0
      maxviolation = model->row_lower_[row];
      scale = -1.0;
    } else {
      // ax <= ub --> ax - ub <= 0
      maxviolation = -model->row_upper_[row];
      scale = 1.0;
    }

    complementation.clear();
    reducedcost.clear();
    upper.clear();
    indices.clear();
    positions.clear();
    complementation.reserve(rowsize[row]);
    reducedcost.reserve(rowsize[row]);
    upper.reserve(rowsize[row]);
    indices.reserve(rowsize[row]);
    positions.reserve(rowsize[row]);
    stack.reserve(rowsize[row]);
    stack.push_back(rowroot[row]);

    bool skiprow = false;

    while (!stack.empty()) {
      // pop element from stack
      HighsInt pos = stack.back();
      stack.pop_back();

      // add non-zeros to stack
      if (ARright[pos] != -1) stack.push_back(ARright[pos]);
      if (ARleft[pos] != -1) stack.push_back(ARleft[pos]);

      // get column index
      HighsInt col = Acol[pos];

      // skip row if a column bound is not finite
      skiprow = model->col_lower_[col] == -kHighsInf ||
                model->col_upper_[col] == kHighsInf;
      if (skiprow) break;

      // compute maximum violation
      // scale =  1:  ax <=  ub --> violation =  ax - ub > 0
      // scale = -1: -ax <= -lb --> violation = -ax + lb > 0
      // this means that for scale = 1 we sum up an upper bound on constraint
      // activity, and for scale = -1 we sum up a lower bound on constraint
      // activity.
      int8_t comp;
      double weight = Avalue[pos] * scale;
      double ub = model->col_upper_[col] - model->col_lower_[col];
      if (weight > 0) {
        comp = 1;
        maxviolation += model->col_upper_[col] * weight;
      } else {
        comp = -1;
        maxviolation += model->col_lower_[col] * weight;
        weight = -weight;
      }

      if (ub <= primal_feastol || weight <= primal_feastol) continue;

      if (model->integrality_[col] == HighsVarType::kContinuous) {
        continuouscontribution += weight * ub;
        continue;
      }

      indices.push_back(reducedcost.size());
      positions.push_back(pos);
      reducedcost.push_back(weight);
      complementation.push_back(comp);
      upper.push_back(ub);
    }

    // Check for timeout according to frequency, unless a particularly
    // dense row has just been analysed
    if ((row & check_time_frequency) == 0 || 10 * rowsize[row] > rowsize_limit)
      HPRESOLVE_CHECKED_CALL(checkTimeLimit());

    if (skiprow) {
      stack.clear();
      continue;
    }

    // maxviolation <= 0 implies that the constraint is redundant:
    // scale =  1: upper bound on activity <= model->row_upper_[row]
    // scale = -1: model->row_lower_[row]  <= lower bound on activity
    if (maxviolation <= primal_feastol) {
      HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, row));
      continue;
    }

    const double smallVal =
        std::max(100 * primal_feastol,
                 primal_feastol * static_cast<double>(maxviolation));
    while (true) {
      if (maxviolation - continuouscontribution <= smallVal || indices.empty())
        break;

      pdqsort(indices.begin(), indices.end(), [&](HighsInt i1, HighsInt i2) {
        return std::make_pair(reducedcost[i1], i1) >
               std::make_pair(reducedcost[i2], i2);
      });

      HighsCDouble lambda = maxviolation - continuouscontribution;

      cover.clear();
      cover.reserve(indices.size());

      for (size_t i = indices.size(); i > 0; --i) {
        HighsInt index = indices[i - 1];
        double delta = upper[index] * reducedcost[index];

        if (upper[index] <= 1000.0 && reducedcost[index] > smallVal &&
            lambda - delta <= smallVal)
          cover.push_back(index);
        else
          lambda -= delta;
      }

      if (cover.empty() || lambda <= smallVal) break;

      HighsInt alpos = *std::min_element(
          cover.begin(), cover.end(), [&](HighsInt i1, HighsInt i2) {
            if (reducedcost[i1] <= 1e-3 || reducedcost[i2] <= 1e-3)
              return reducedcost[i1] > reducedcost[i2];
            return reducedcost[i1] < reducedcost[i2];
          });

      double al = reducedcost[alpos];
      coefs.resize(cover.size());
      double coverrhs = std::max(
          std::ceil(static_cast<double>(lambda / al - primal_feastol)), 1.0);
      HighsCDouble slackupper = -coverrhs;

      double step = kHighsInf;
      for (size_t i = 0; i != cover.size(); ++i) {
        coefs[i] = std::ceil(
            std::min(reducedcost[cover[i]], static_cast<double>(lambda)) / al -
            options->small_matrix_value);
        slackupper += upper[cover[i]] * coefs[i];
        step = std::min(step, reducedcost[cover[i]] / coefs[i]);
      }
      step = std::min(step, static_cast<double>(maxviolation / coverrhs));
      maxviolation -= step * coverrhs;

      HighsInt slackind = reducedcost.size();
      reducedcost.push_back(step);
      upper.push_back(static_cast<double>(slackupper));

      for (size_t i = 0; i != cover.size(); ++i)
        reducedcost[cover[i]] -= step * coefs[i];

      indices.erase(std::remove_if(indices.begin(), indices.end(),
                                   [&](HighsInt i) {
                                     return reducedcost[i] <= primal_feastol;
                                   }),
                    indices.end());
      indices.push_back(slackind);
    }

    double threshold = static_cast<double>(maxviolation + primal_feastol);

    indices.erase(std::remove_if(indices.begin(), indices.end(),
                                 [&](HighsInt i) {
                                   return static_cast<size_t>(i) >=
                                              positions.size() ||
                                          std::abs(reducedcost[i]) <= threshold;
                                 }),
                  indices.end());
    if (indices.empty()) continue;

    auto updateNonZeros = [&](HighsInt row, HighsCDouble& rhs,
                              HighsInt direction) {
      for (HighsInt i : indices) {
        assert(Arow[positions[i]] == row);
        double coefdelta =
            direction * static_cast<double>(reducedcost[i] - maxviolation);
        HighsInt col = Acol[positions[i]];

        if (complementation[i] == -1) {
          rhs += coefdelta * model->col_lower_[col];
          addToMatrix(row, col, coefdelta);
        } else {
          rhs -= coefdelta * model->col_upper_[col];
          addToMatrix(row, col, -coefdelta);
        }
      }
    };

    // update / add non-zeros
    if (scale < 0) {
      HighsCDouble lhs = model->row_lower_[row];
      updateNonZeros(row, lhs, HighsInt{-1});
      model->row_lower_[row] = static_cast<double>(lhs);
    } else {
      HighsCDouble rhs = model->row_upper_[row];
      updateNonZeros(row, rhs, HighsInt{1});
      model->row_upper_[row] = static_cast<double>(rhs);
    }

    num_strengthened += indices.size();
  }

  return Result::kOk;
}